

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall
adios2::core::Engine::DoGetDeferred(Engine *this,Variable<unsigned_char> *param_2,uint8_t *param_3)

{
  string *in_stack_000000a8;
  Engine *in_stack_000000b0;
  allocator local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"DoGetDeferred",&local_39);
  ThrowUp(in_stack_000000b0,in_stack_000000a8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void Engine::DoGetStructSync(VariableStruct &, void *) { ThrowUp("DoGetSync for Struct Variable"); }